

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O0

PercentMatcher * __thiscall
icu_63::numparse::impl::PercentMatcher::operator=(PercentMatcher *this,PercentMatcher *param_1)

{
  PercentMatcher *param_1_local;
  PercentMatcher *this_local;
  
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  return this;
}

Assistant:

class U_I18N_API PercentMatcher : public SymbolMatcher {
  public:
    PercentMatcher() = default;  // WARNING: Leaves the object in an unusable state

    PercentMatcher(const DecimalFormatSymbols& dfs);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;
}